

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O0

size_type __thiscall lf::mesh::hybrid2d::MeshFactory::AddPoint(MeshFactory *this,coord_t *coord)

{
  ulong uVar1;
  size_type sVar2;
  undefined1 local_2a8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_2a0;
  GeometryPtr point_geo;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  coord_t *local_18;
  coord_t *coord_local;
  MeshFactory *this_local;
  
  local_18 = coord;
  coord_local = (coord_t *)this;
  uVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&coord->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  if (uVar1 != this->dim_world_) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"coord has incompatible number of rows.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"coord.rows() == dim_world_",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x14,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"",
               (allocator<char> *)
               ((long)&point_geo._M_t.
                       super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                       .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 7));
    lf::base::AssertionFailed(&local_240,&local_268,0x14,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&point_geo._M_t.
                       super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                       .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 7));
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,1,0,_1,1>&>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_2a8);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_2a0,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_2a8
            );
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_2a8
            );
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
  ::
  emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
            ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
              *)&this->nodes_,&local_2a0);
  sVar2 = std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::size(&this->nodes_);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_2a0);
  return (int)sVar2 - 1;
}

Assistant:

MeshFactory::size_type MeshFactory::AddPoint(coord_t coord) {
  LF_ASSERT_MSG(coord.rows() == dim_world_,
                "coord has incompatible number of rows.");
  // Create default geometry object for a point from location vector
  hybrid2d::Mesh::GeometryPtr point_geo =
      std::make_unique<geometry::Point>(coord);
  nodes_.emplace_back(std::move(point_geo));
  return nodes_.size() - 1;
}